

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O0

void __thiscall
SwitchIRBuilder::TryBuildBinaryTreeOrMultiBrForSwitchInts
          (SwitchIRBuilder *this,MultiBranchInstr **multiBranchInstr,uint32 fallthrOffset,
          int startjmpTableIndex,int endjmpTableIndex,int startBinaryTravIndex,
          uint32 defaultTargetOffset)

{
  uint32 targetOffset;
  Instr *this_00;
  MultiBranchInstr *pMVar1;
  int endBinaryTravIndex;
  int startBinaryTravIndex_local;
  int endjmpTableIndex_local;
  int startjmpTableIndex_local;
  uint32 fallthrOffset_local;
  MultiBranchInstr **multiBranchInstr_local;
  SwitchIRBuilder *this_local;
  
  if ((startjmpTableIndex != startBinaryTravIndex) &&
     (BuildBinaryTraverseInstr(this,startBinaryTravIndex,startjmpTableIndex + -1,fallthrOffset),
     *multiBranchInstr != (MultiBranchInstr *)0x0)) {
    pMVar1 = *multiBranchInstr;
    this_00 = IR::Instr::GetNextRealInstr((Instr *)*multiBranchInstr);
    targetOffset = IR::Instr::GetByteCodeOffset(this_00);
    FixUpMultiBrJumpTable(this,pMVar1,targetOffset);
    *multiBranchInstr = (MultiBranchInstr *)0x0;
  }
  if (*multiBranchInstr != (MultiBranchInstr *)0x0) {
    FixUpMultiBrJumpTable(this,*multiBranchInstr,fallthrOffset);
    *multiBranchInstr = (MultiBranchInstr *)0x0;
  }
  pMVar1 = BuildMultiBrCaseInstrForInts
                     (this,startjmpTableIndex,endjmpTableIndex,defaultTargetOffset);
  *multiBranchInstr = pMVar1;
  return;
}

Assistant:

void
SwitchIRBuilder::TryBuildBinaryTreeOrMultiBrForSwitchInts(IR::MultiBranchInstr * &multiBranchInstr, uint32 fallthrOffset, int startjmpTableIndex, int endjmpTableIndex, int startBinaryTravIndex, uint32 defaultTargetOffset)
{
    int endBinaryTravIndex = startjmpTableIndex;

    //Try Building Binary tree, if there are available case arms, as indicated by the boundary offsets
    if (endBinaryTravIndex != startBinaryTravIndex)
    {
        endBinaryTravIndex = startjmpTableIndex - 1;
        BuildBinaryTraverseInstr(startBinaryTravIndex, endBinaryTravIndex, fallthrOffset);
        //Fix up the fallthrOffset for the previous multiBrInstr, if one existed
        //Example => Binary tree immediately succeeds a MultiBr Instr
        if (multiBranchInstr)
        {
            FixUpMultiBrJumpTable(multiBranchInstr, multiBranchInstr->GetNextRealInstr()->GetByteCodeOffset());
            multiBranchInstr = nullptr;
        }
    }

    //Fix up the fallthrOffset for the previous multiBrInstr, if one existed
    //Example -> A multiBr can be followed by another multiBr
    if (multiBranchInstr)
    {
        FixUpMultiBrJumpTable(multiBranchInstr, fallthrOffset);
        multiBranchInstr = nullptr;
    }
    multiBranchInstr = BuildMultiBrCaseInstrForInts(startjmpTableIndex, endjmpTableIndex, defaultTargetOffset);

    //We currently assign the offset of the multiBr Instr same as the offset of the last instruction of the case arm selected for building the jump table
    //AssertMsg(m_lastInstr->GetByteCodeOffset() == fallthrOffset, "The fallthrough offset to the multi branch instruction is wrong");
}